

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O2

int accept_pathname(char *pathname)

{
  int iVar1;
  
  if (include.stqh_first == (pattern *)0x0) {
LAB_00104e6f:
    if (exclude.stqh_first != (pattern *)0x0) {
      iVar1 = match_pattern(&exclude,pathname);
      if (iVar1 != 0) goto LAB_00104e8c;
    }
    iVar1 = 1;
  }
  else {
    iVar1 = match_pattern(&include,pathname);
    if (iVar1 != 0) goto LAB_00104e6f;
LAB_00104e8c:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
accept_pathname(const char *pathname)
{

	if (!STAILQ_EMPTY(&include) && !match_pattern(&include, pathname))
		return (0);
	if (!STAILQ_EMPTY(&exclude) && match_pattern(&exclude, pathname))
		return (0);
	return (1);
}